

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_poly(rf_vec2 center,int sides,float radius,float rotation,rf_color color)

{
  rf_render_batch *prVar1;
  long lVar2;
  rf_vertex_buffer *prVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float local_40;
  float local_38;
  float fStack_34;
  
  uVar4 = 3;
  if (3 < sides) {
    uVar4 = sides;
  }
  prVar1 = (rf__ctx->field_0).current_batch;
  lVar2 = prVar1->current_buffer;
  prVar3 = prVar1->vertex_buffers;
  if (prVar3[lVar2].elements_count * 4 <= (int)(0x168 / (ulong)uVar4) * 4 + prVar3[lVar2].v_counter)
  {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_38 = center.x;
  fStack_34 = center.y;
  local_40 = 0.0;
  rf_gfx_translatef(local_38,fStack_34,0.0);
  rf_gfx_rotatef(rotation,0.0,0.0,1.0);
  rf_gfx_begin(RF_TRIANGLES);
  uVar5 = (ulong)uVar4;
  do {
    rf_gfx_color4ub(color.r,color.g,color.b,color.a);
    rf_gfx_vertex3f(0.0,0.0,((rf__ctx->field_0).current_batch)->current_depth);
    fVar6 = sinf(local_40 * 0.017453292);
    fVar7 = cosf(local_40 * 0.017453292);
    rf_gfx_vertex3f(fVar6 * radius,fVar7 * radius,((rf__ctx->field_0).current_batch)->current_depth)
    ;
    local_40 = local_40 + 360.0 / (float)(int)uVar4;
    fVar6 = sinf(local_40 * 0.017453292);
    fVar7 = cosf(local_40 * 0.017453292);
    rf_gfx_vertex3f(fVar6 * radius,fVar7 * radius,((rf__ctx->field_0).current_batch)->current_depth)
    ;
    uVar5 = uVar5 - 1;
  } while (uVar5 != 0);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_poly(rf_vec2 center, int sides, float radius, float rotation, rf_color color)
{
    if (sides < 3) sides = 3;
    float centralAngle = 0.0f;

    if (rf_gfx_check_buffer_limit(4 * (360/sides))) rf_gfx_draw();

    rf_gfx_push_matrix();
    rf_gfx_translatef(center.x, center.y, 0.0f);
    rf_gfx_rotatef(rotation, 0.0f, 0.0f, 1.0f);
    rf_gfx_begin(RF_TRIANGLES);
    for (rf_int i = 0; i < sides; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(0, 0);
        rf_gfx_vertex2f(sinf(RF_DEG2RAD*centralAngle)*radius, cosf(RF_DEG2RAD*centralAngle)*radius);

        centralAngle += 360.0f/(float)sides;
        rf_gfx_vertex2f(sinf(RF_DEG2RAD*centralAngle)*radius, cosf(RF_DEG2RAD*centralAngle)*radius);
    }
    rf_gfx_end();

    rf_gfx_pop_matrix();
}